

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O3

Entity_State_PDU * __thiscall
KDIS::PDU::Entity_State_PDU::operator=(Entity_State_PDU *this,Entity_State_PDU *Other)

{
  undefined8 uVar1;
  KFLOAT64 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT16 KVar6;
  KUINT8 KVar7;
  KUINT8 KVar8;
  KFLOAT32 KVar9;
  KOCTET KVar10;
  KOCTET KVar11;
  KOCTET KVar12;
  KOCTET KVar13;
  KOCTET KVar14;
  KOCTET KVar15;
  KOCTET KVar16;
  KCHAR8 KVar17;
  KCHAR8 KVar18;
  KCHAR8 KVar19;
  KCHAR8 KVar20;
  KCHAR8 KVar21;
  KCHAR8 KVar22;
  KCHAR8 KVar23;
  DeadReckoningCalculator *pDVar24;
  long lVar25;
  TMATRIX *pTVar26;
  TMATRIX *pTVar27;
  DeadReckoningCalculator *pDVar28;
  byte bVar29;
  
  bVar29 = 0;
  if (this != Other) {
    KVar3 = (Other->super_Header).super_Header6.m_ui8ExerciseID;
    KVar4 = (Other->super_Header).super_Header6.m_ui8PDUType;
    KVar5 = (Other->super_Header).super_Header6.m_ui8ProtocolFamily;
    (this->super_Header).super_Header6.m_ui8ProtocolVersion =
         (Other->super_Header).super_Header6.m_ui8ProtocolVersion;
    (this->super_Header).super_Header6.m_ui8ExerciseID = KVar3;
    (this->super_Header).super_Header6.m_ui8PDUType = KVar4;
    (this->super_Header).super_Header6.m_ui8ProtocolFamily = KVar5;
    (this->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion =
         (Other->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion;
    (this->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel =
         (Other->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel;
    KVar3 = (Other->super_Header).super_Header6.m_ui8Padding1;
    KVar4 = (Other->super_Header).super_Header6.m_ui8Padding2;
    (this->super_Header).super_Header6.m_ui16PDULength =
         (Other->super_Header).super_Header6.m_ui16PDULength;
    (this->super_Header).super_Header6.m_ui8Padding1 = KVar3;
    (this->super_Header).super_Header6.m_ui8Padding2 = KVar4;
    (this->super_Header).super_Header6.field_0x26 = (Other->super_Header).super_Header6.field_0x26;
    *(undefined2 *)&(this->super_Header).super_Header6.field_0x24 =
         *(undefined2 *)&(Other->super_Header).super_Header6.field_0x24;
    KVar6 = (Other->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID;
    (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
         (Other->m_EntityID).super_SimulationIdentifier.m_ui16SiteID;
    (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar6;
    *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
         *(undefined2 *)&(Other->m_EntityID).super_SimulationIdentifier.field_0xc;
    this->m_ui8ForceID = Other->m_ui8ForceID;
    this->m_ui8NumOfVariableParams = Other->m_ui8NumOfVariableParams;
    KVar3 = (Other->m_EntityType).m_ui8Domain;
    KVar6 = (Other->m_EntityType).m_ui16Country;
    KVar4 = (Other->m_EntityType).m_ui8Category;
    KVar5 = (Other->m_EntityType).m_ui8SubCategory;
    KVar7 = (Other->m_EntityType).m_ui8Specific;
    KVar8 = (Other->m_EntityType).m_ui8Extra;
    (this->m_EntityType).m_ui8EntityKind = (Other->m_EntityType).m_ui8EntityKind;
    (this->m_EntityType).m_ui8Domain = KVar3;
    (this->m_EntityType).m_ui16Country = KVar6;
    (this->m_EntityType).m_ui8Category = KVar4;
    (this->m_EntityType).m_ui8SubCategory = KVar5;
    (this->m_EntityType).m_ui8Specific = KVar7;
    (this->m_EntityType).m_ui8Extra = KVar8;
    KVar3 = (Other->m_AltEntityType).m_ui8Domain;
    KVar6 = (Other->m_AltEntityType).m_ui16Country;
    KVar4 = (Other->m_AltEntityType).m_ui8Category;
    KVar5 = (Other->m_AltEntityType).m_ui8SubCategory;
    KVar7 = (Other->m_AltEntityType).m_ui8Specific;
    KVar8 = (Other->m_AltEntityType).m_ui8Extra;
    (this->m_AltEntityType).m_ui8EntityKind = (Other->m_AltEntityType).m_ui8EntityKind;
    (this->m_AltEntityType).m_ui8Domain = KVar3;
    (this->m_AltEntityType).m_ui16Country = KVar6;
    (this->m_AltEntityType).m_ui8Category = KVar4;
    (this->m_AltEntityType).m_ui8SubCategory = KVar5;
    (this->m_AltEntityType).m_ui8Specific = KVar7;
    (this->m_AltEntityType).m_ui8Extra = KVar8;
    (this->m_EntityLinearVelocity).m_f32Z = (Other->m_EntityLinearVelocity).m_f32Z;
    KVar9 = (Other->m_EntityLinearVelocity).m_f32Y;
    (this->m_EntityLinearVelocity).m_f32X = (Other->m_EntityLinearVelocity).m_f32X;
    (this->m_EntityLinearVelocity).m_f32Y = KVar9;
    (this->m_EntityLocation).m_f64Z = (Other->m_EntityLocation).m_f64Z;
    KVar2 = (Other->m_EntityLocation).m_f64Y;
    (this->m_EntityLocation).m_f64X = (Other->m_EntityLocation).m_f64X;
    (this->m_EntityLocation).m_f64Y = KVar2;
    (this->m_EntityOrientation).m_f32Phi = (Other->m_EntityOrientation).m_f32Phi;
    KVar9 = (Other->m_EntityOrientation).m_f32Theta;
    (this->m_EntityOrientation).m_f32Psi = (Other->m_EntityOrientation).m_f32Psi;
    (this->m_EntityOrientation).m_f32Theta = KVar9;
    (this->m_EntityAppearance).m_Appearance = (Other->m_EntityAppearance).m_Appearance;
    KVar10 = (Other->m_DeadReckoningParameter).m_OtherParams[0];
    KVar11 = (Other->m_DeadReckoningParameter).m_OtherParams[1];
    KVar12 = (Other->m_DeadReckoningParameter).m_OtherParams[2];
    KVar13 = (Other->m_DeadReckoningParameter).m_OtherParams[3];
    KVar14 = (Other->m_DeadReckoningParameter).m_OtherParams[4];
    KVar15 = (Other->m_DeadReckoningParameter).m_OtherParams[5];
    KVar16 = (Other->m_DeadReckoningParameter).m_OtherParams[6];
    uVar1 = *(undefined8 *)((Other->m_DeadReckoningParameter).m_OtherParams + 7);
    (this->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm =
         (Other->m_DeadReckoningParameter).m_ui8DeadRecknoningAlgorithm;
    (this->m_DeadReckoningParameter).m_OtherParams[0] = KVar10;
    (this->m_DeadReckoningParameter).m_OtherParams[1] = KVar11;
    (this->m_DeadReckoningParameter).m_OtherParams[2] = KVar12;
    (this->m_DeadReckoningParameter).m_OtherParams[3] = KVar13;
    (this->m_DeadReckoningParameter).m_OtherParams[4] = KVar14;
    (this->m_DeadReckoningParameter).m_OtherParams[5] = KVar15;
    (this->m_DeadReckoningParameter).m_OtherParams[6] = KVar16;
    *(undefined8 *)((this->m_DeadReckoningParameter).m_OtherParams + 7) = uVar1;
    (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z =
         (Other->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Z;
    KVar9 = (Other->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y;
    (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X =
         (Other->m_DeadReckoningParameter).m_LinearAcceleration.m_f32X;
    (this->m_DeadReckoningParameter).m_LinearAcceleration.m_f32Y = KVar9;
    (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z =
         (Other->m_DeadReckoningParameter).m_AngularVelocity.m_f32Z;
    KVar9 = (Other->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y;
    (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32X =
         (Other->m_DeadReckoningParameter).m_AngularVelocity.m_f32X;
    (this->m_DeadReckoningParameter).m_AngularVelocity.m_f32Y = KVar9;
    KVar17 = (Other->m_EntityMarking).m_sEntityMarkingString[0];
    KVar18 = (Other->m_EntityMarking).m_sEntityMarkingString[1];
    KVar19 = (Other->m_EntityMarking).m_sEntityMarkingString[2];
    KVar20 = (Other->m_EntityMarking).m_sEntityMarkingString[3];
    KVar21 = (Other->m_EntityMarking).m_sEntityMarkingString[4];
    KVar22 = (Other->m_EntityMarking).m_sEntityMarkingString[5];
    KVar23 = (Other->m_EntityMarking).m_sEntityMarkingString[6];
    uVar1 = *(undefined8 *)((Other->m_EntityMarking).m_sEntityMarkingString + 4);
    (this->m_EntityMarking).m_ui8EntityMarkingCharacterSet =
         (Other->m_EntityMarking).m_ui8EntityMarkingCharacterSet;
    (this->m_EntityMarking).m_sEntityMarkingString[0] = KVar17;
    (this->m_EntityMarking).m_sEntityMarkingString[1] = KVar18;
    (this->m_EntityMarking).m_sEntityMarkingString[2] = KVar19;
    (this->m_EntityMarking).m_sEntityMarkingString[3] = KVar20;
    (this->m_EntityMarking).m_sEntityMarkingString[4] = KVar21;
    (this->m_EntityMarking).m_sEntityMarkingString[5] = KVar22;
    (this->m_EntityMarking).m_sEntityMarkingString[6] = KVar23;
    *(undefined8 *)((this->m_EntityMarking).m_sEntityMarkingString + 4) = uVar1;
    (this->m_EntityCapabilities).field_0 = (Other->m_EntityCapabilities).field_0;
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ::operator=(&this->m_vVariableParameters,&Other->m_vVariableParameters);
    pDVar24 = this->m_pDrCalc;
    pDVar28 = Other->m_pDrCalc;
    if (pDVar24 != pDVar28 && pDVar24 != (DeadReckoningCalculator *)0x0) {
      UTILS::DeadReckoningCalculator::~DeadReckoningCalculator(pDVar24);
      operator_delete(pDVar24,0x170);
      pDVar28 = Other->m_pDrCalc;
    }
    if (pDVar28 == (DeadReckoningCalculator *)0x0) {
      pDVar24 = (DeadReckoningCalculator *)0x0;
    }
    else {
      pDVar24 = (DeadReckoningCalculator *)operator_new(0x170);
      (pDVar24->m_initPosition).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__DataTypeBase_00223df0;
      KVar2 = (pDVar28->m_initPosition).m_f64Y;
      (pDVar24->m_initPosition).m_f64X = (pDVar28->m_initPosition).m_f64X;
      (pDVar24->m_initPosition).m_f64Y = KVar2;
      (pDVar24->m_initPosition).m_f64Z = (pDVar28->m_initPosition).m_f64Z;
      (pDVar24->m_initLinearVelocity).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__DataTypeBase_00223d98;
      KVar9 = (pDVar28->m_initLinearVelocity).m_f32Y;
      (pDVar24->m_initLinearVelocity).m_f32X = (pDVar28->m_initLinearVelocity).m_f32X;
      (pDVar24->m_initLinearVelocity).m_f32Y = KVar9;
      (pDVar24->m_initLinearVelocity).m_f32Z = (pDVar28->m_initLinearVelocity).m_f32Z;
      (pDVar24->m_initLinearAcceleration).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__DataTypeBase_00223d98;
      KVar9 = (pDVar28->m_initLinearAcceleration).m_f32Y;
      (pDVar24->m_initLinearAcceleration).m_f32X = (pDVar28->m_initLinearAcceleration).m_f32X;
      (pDVar24->m_initLinearAcceleration).m_f32Y = KVar9;
      (pDVar24->m_initLinearAcceleration).m_f32Z = (pDVar28->m_initLinearAcceleration).m_f32Z;
      (pDVar24->m_Ab).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__DataTypeBase_00223d98;
      (pDVar24->m_Ab).m_f32Z = (pDVar28->m_Ab).m_f32Z;
      KVar9 = (pDVar28->m_Ab).m_f32Y;
      (pDVar24->m_Ab).m_f32X = (pDVar28->m_Ab).m_f32X;
      (pDVar24->m_Ab).m_f32Y = KVar9;
      pDVar24->m_bQuaxAxisSet = pDVar28->m_bQuaxAxisSet;
      (pDVar24->m_quatAxis).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__DataTypeBase_00223d98;
      (pDVar24->m_quatAxis).m_f32Z = (pDVar28->m_quatAxis).m_f32Z;
      KVar9 = (pDVar28->m_quatAxis).m_f32Y;
      (pDVar24->m_quatAxis).m_f32X = (pDVar28->m_quatAxis).m_f32X;
      (pDVar24->m_quatAxis).m_f32Y = KVar9;
      pDVar24->m_f64Magnitude = pDVar28->m_f64Magnitude;
      (pDVar24->m_initOrientation).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__EulerAngles_00223aa8;
      (pDVar24->m_initOrientation).m_f32Phi = (pDVar28->m_initOrientation).m_f32Phi;
      KVar9 = (pDVar28->m_initOrientation).m_f32Theta;
      (pDVar24->m_initOrientation).m_f32Psi = (pDVar28->m_initOrientation).m_f32Psi;
      (pDVar24->m_initOrientation).m_f32Theta = KVar9;
      (pDVar24->m_initEulerAngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__EulerAngles_00223aa8;
      KVar9 = (pDVar28->m_initEulerAngularVelocity).m_f32Theta;
      (pDVar24->m_initEulerAngularVelocity).m_f32Psi =
           (pDVar28->m_initEulerAngularVelocity).m_f32Psi;
      (pDVar24->m_initEulerAngularVelocity).m_f32Theta = KVar9;
      (pDVar24->m_initEulerAngularVelocity).m_f32Phi =
           (pDVar28->m_initEulerAngularVelocity).m_f32Phi;
      pTVar26 = &pDVar28->m_initOrientationMatrix;
      pTVar27 = &pDVar24->m_initOrientationMatrix;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(undefined8 *)pTVar27->Data[0] = *(undefined8 *)pTVar26->Data[0];
        pTVar26 = (TMATRIX *)((long)pTVar26 + (ulong)bVar29 * -0x10 + 8);
        pTVar27 = (TMATRIX *)((long)pTVar27 + (ulong)bVar29 * -0x10 + 8);
      }
      (pDVar24->m_initAngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
           (_func_int **)&PTR__DataTypeBase_00223d98;
      (pDVar24->m_initAngularVelocity).m_f32Z = (pDVar28->m_initAngularVelocity).m_f32Z;
      KVar9 = (pDVar28->m_initAngularVelocity).m_f32Y;
      (pDVar24->m_initAngularVelocity).m_f32X = (pDVar28->m_initAngularVelocity).m_f32X;
      (pDVar24->m_initAngularVelocity).m_f32Y = KVar9;
      pTVar26 = &pDVar28->m_wwMatrix;
      pTVar27 = &pDVar24->m_wwMatrix;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(undefined8 *)pTVar27->Data[0] = *(undefined8 *)pTVar26->Data[0];
        pTVar26 = (TMATRIX *)((long)pTVar26 + (ulong)bVar29 * -0x10 + 8);
        pTVar27 = (TMATRIX *)((long)pTVar27 + (ulong)bVar29 * -0x10 + 8);
      }
      pDVar24->m_DRA = pDVar28->m_DRA;
    }
    this->m_pDrCalc = pDVar24;
  }
  return this;
}

Assistant:

Entity_State_PDU & Entity_State_PDU::operator=( const Entity_State_PDU & Other )
{
    if(this != &Other) {
        Header::operator=(Other);
        m_EntityID = Other.m_EntityID;
        m_ui8ForceID = Other.m_ui8ForceID;
        m_ui8NumOfVariableParams = Other.m_ui8NumOfVariableParams;
        m_EntityType = Other.m_EntityType;
        m_AltEntityType = Other.m_AltEntityType;
        m_EntityLinearVelocity = Other.m_EntityLinearVelocity;
        m_EntityLocation = Other.m_EntityLocation;
        m_EntityOrientation = Other.m_EntityOrientation;
        m_EntityAppearance = Other.m_EntityAppearance;
        m_DeadReckoningParameter = Other.m_DeadReckoningParameter;
        m_EntityMarking = Other.m_EntityMarking;
        m_EntityCapabilities = Other.m_EntityCapabilities;
        m_vVariableParameters = Other.m_vVariableParameters;

        if (m_pDrCalc && m_pDrCalc != Other.m_pDrCalc)
            delete m_pDrCalc;
        m_pDrCalc = (Other.m_pDrCalc ? new DeadReckoningCalculator(*Other.m_pDrCalc) : NULL);
    }
    return *this;
}